

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

Var mapVar(Var x,vec<int,_int> *map,Var *max)

{
  int iVar1;
  int local_1c;
  
  if ((map->sz <= x) || (map->data[x] == -1)) {
    local_1c = -1;
    Minisat::vec<int,_int>::growTo(map,x + 1,&local_1c);
    iVar1 = *max;
    *max = iVar1 + 1;
    map->data[x] = iVar1;
  }
  return map->data[x];
}

Assistant:

static Var mapVar(Var x, vec<Var>& map, Var& max)
{
    if (map.size() <= x || map[x] == -1){
        map.growTo(x+1, -1);
        map[x] = max++;
    }
    return map[x];
}